

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFXRefEntry.cc
# Opt level: O0

void __thiscall
QPDFXRefEntry::QPDFXRefEntry(QPDFXRefEntry *this,int type,qpdf_offset_t field1,int field2)

{
  logic_error *this_00;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int local_24;
  qpdf_offset_t qStack_20;
  int field2_local;
  qpdf_offset_t field1_local;
  QPDFXRefEntry *pQStack_10;
  int type_local;
  QPDFXRefEntry *this_local;
  
  this->type = type;
  this->field1 = field1;
  this->field2 = field2;
  if ((0 < type) && (type < 3)) {
    return;
  }
  local_24 = field2;
  qStack_20 = field1;
  field1_local._4_4_ = type;
  pQStack_10 = this;
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_68,field1_local._4_4_);
  std::operator+(&local_48,"invalid xref type ",&local_68);
  std::logic_error::logic_error(this_00,(string *)&local_48);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

QPDFXRefEntry::QPDFXRefEntry(int type, qpdf_offset_t field1, int field2) :
    type(type),
    field1(field1),
    field2(field2)
{
    if ((type < 1) || (type > 2)) {
        throw std::logic_error("invalid xref type " + std::to_string(type));
    }
}